

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abeta.hpp
# Opt level: O0

vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> * __thiscall
minimax::ABeta<ttt::Board,_minimax::Eval<ttt::Board>_>::operator()
          (ABeta<ttt::Board,_minimax::Eval<ttt::Board>_> *this,Board *game,int depth)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  int in_ECX;
  undefined8 *in_RDX;
  Board *in_RDI;
  vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> r;
  future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_> *f;
  iterator __end2;
  iterator __begin2;
  vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
  *__range2;
  int i;
  mutex mutex;
  int num_threads;
  vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
  futures;
  vector<long,_std::allocator<long>_> moves;
  vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *results;
  vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
  *in_stack_fffffffffffffe78;
  __normal_iterator<const_std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
  *in_stack_fffffffffffffe80;
  future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
  *in_stack_fffffffffffffe88;
  iterator in_stack_fffffffffffffe90;
  iterator in_stack_fffffffffffffea8;
  vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>
  *in_stack_fffffffffffffec0;
  __normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
  in_stack_fffffffffffffec8;
  __normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
  in_stack_fffffffffffffed0;
  iterator in_stack_fffffffffffffed8;
  type *in_stack_fffffffffffffef0;
  launch in_stack_fffffffffffffefc;
  __normal_iterator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_*,_std::vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>_>
  local_d8;
  undefined1 *local_d0;
  undefined1 local_c5;
  undefined8 local_b8;
  undefined2 local_b0;
  int local_ac;
  undefined1 *local_a8;
  undefined1 *local_a0;
  int local_84;
  undefined1 local_80 [44];
  int local_54;
  undefined1 local_50 [24];
  undefined1 local_38 [28];
  int local_1c;
  undefined8 *local_18;
  
  if (in_ECX < 1) {
    memset(in_RDI,0,0x18);
    std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>::vector
              ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)
               0x227c28);
  }
  else {
    local_1c = in_ECX;
    local_18 = in_RDX;
    ttt::Board::GetPossibleMoves(in_RDI);
    std::
    vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ::vector((vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
              *)0x227c4f);
    local_54 = std::thread::hardware_concurrency();
    std::mutex::mutex((mutex *)0x227c68);
    for (local_84 = 0; local_84 < local_54; local_84 = local_84 + 1) {
      local_b0 = *(undefined2 *)(local_18 + 1);
      local_b8 = *local_18;
      local_ac = local_1c;
      local_a8 = local_38;
      local_a0 = local_80;
      std::operator()(in_stack_fffffffffffffefc,in_stack_fffffffffffffef0);
      std::
      vector<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,std::allocator<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>>>
      ::
      emplace_back<std::future<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>>
                ((vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
                  *)in_stack_fffffffffffffe90._M_current,in_stack_fffffffffffffe88);
      std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
      ::~future((future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                 *)0x227d14);
    }
    local_c5 = 0;
    std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>::vector
              ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)
               0x227d7b);
    local_d0 = local_50;
    local_d8._M_current =
         (future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_> *
         )std::
          vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
          ::begin(in_stack_fffffffffffffe78);
    std::
    vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ::end(in_stack_fffffffffffffe78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_*,_std::vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>_>
                               *)in_stack_fffffffffffffe80,
                              (__normal_iterator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_*,_std::vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>_>
                               *)in_stack_fffffffffffffe78), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_*,_std::vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>_>
      ::operator*(&local_d8);
      std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
      ::get((future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
             *)in_stack_fffffffffffffea8._M_current);
      in_stack_fffffffffffffea8 =
           std::end<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>
                     ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)
                      in_stack_fffffffffffffe78);
      __gnu_cxx::
      __normal_iterator<std::pair<long,double>const*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>
      ::__normal_iterator<std::pair<long,double>*>
                (in_stack_fffffffffffffe80,
                 (__normal_iterator<std::pair<long,_double>_*,_std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>
                  *)in_stack_fffffffffffffe78);
      std::begin<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>
                ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)
                 in_stack_fffffffffffffe78);
      std::end<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>
                ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)
                 in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe90 =
           std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>::
           insert<__gnu_cxx::__normal_iterator<std::pair<long,double>*,std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>,void>
                     (in_stack_fffffffffffffec0,in_stack_fffffffffffffed8._M_current,
                      in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      in_stack_fffffffffffffed8 = in_stack_fffffffffffffe90;
      std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>::~vector
                ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)
                 in_stack_fffffffffffffe90._M_current);
      __gnu_cxx::
      __normal_iterator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_*,_std::vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>_>
      ::operator++(&local_d8);
    }
    iVar2 = std::begin<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>
                      ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *
                       )in_stack_fffffffffffffe78);
    iVar3 = std::end<std::vector<std::pair<long,double>,std::allocator<std::pair<long,double>>>>
                      ((vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *
                       )in_stack_fffffffffffffe78);
    std::operator()(iVar2._M_current,iVar3._M_current);
    local_c5 = 1;
    std::
    vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
    ::~vector((vector<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>,_std::allocator<std::future<std::vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_>_>_>_>
               *)in_stack_fffffffffffffe90._M_current);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe90._M_current);
  }
  return (vector<std::pair<long,_double>,_std::allocator<std::pair<long,_double>_>_> *)in_RDI;
}

Assistant:

std::vector<std::pair<game::IMove, double>>
ABeta<IGame, Eval>::operator()(const IGame &game, int depth) const
{
    if (depth <= 0)
        return {};

    auto moves = game.GetPossibleMoves();
    std::vector<std::future<std::vector<std::pair<game::IMove, double>>>> futures;
    int num_threads = std::thread::hardware_concurrency();
    std::mutex mutex;

    for (int i = 0; i < num_threads; ++i)
        futures.emplace_back(std::async(std::launch::async, [game, depth, &moves, &mutex] {
            std::vector<std::pair<game::IMove, double>> results;
            while (true)
            {
                mutex.lock();
                if (moves.empty())
                {
                    mutex.unlock();
                    break;
                }
                game::IMove move = moves.back();
                moves.pop_back();
                mutex.unlock();
                IGame new_game(game);
                new_game.ApplyMove(move);
                results.emplace_back(move, -ABeta_<IGame, Eval>(new_game, depth - 1, -std::numeric_limits<double>::max(), std::numeric_limits<double>::max()));
            }
            return results;
        }));

    std::vector<std::pair<game::IMove, double>> results;
    for (auto &f : futures)
    {
        auto r = f.get();
        results.insert(std::end(results), std::begin(r), std::end(r));
    }

    std::sort(std::begin(results), std::end(results), [](const std::pair<game::IMove, double> &e1, const std::pair<game::IMove, double> &e2) {
        return e1.second > e2.second;
    });
    return results;
}